

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

void __thiscall CLI::CallForAllHelp::CallForAllHelp(CallForAllHelp *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  ExitCodes in_stack_00000024;
  string *in_stack_00000028;
  CallForAllHelp *in_stack_00000030;
  allocator<char> local_29 [9];
  allocator<char> *in_stack_ffffffffffffffe0;
  char *in_stack_ffffffffffffffe8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffff0;
  
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  CallForAllHelp(in_stack_00000030,in_stack_00000028,in_stack_00000024);
  ::std::__cxx11::string::~string(in_RDI);
  ::std::allocator<char>::~allocator(local_29);
  return;
}

Assistant:

CallForAllHelp()
        : CallForAllHelp("This should be caught in your main function, see examples", ExitCodes::Success) {}